

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Gia_ManCorrSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (iVar4 = p->nObjs, pGVar2 + iVar4 <= pObj)) goto LAB_005af75d;
  iVar6 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  uVar9 = iVar6 + iVar4 * f;
  if (((int)uVar9 < 0) || ((p->vCopies).nSize <= (int)uVar9)) {
LAB_005af73e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vCopies).pArray[uVar9] != -1) {
    return;
  }
  if ((nPrefix <= f) && (uVar7 = (ulong)(uint)p->pReprs[iVar6] & 0xfffffff, uVar7 != 0xfffffff)) {
    if (iVar4 <= (int)uVar7) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar2 != (Gia_Obj_t *)0x0) {
      pGVar2 = pGVar2 + uVar7;
      Gia_ManCorrSpecReduce_rec(pNew,p,pGVar2,f,nPrefix);
      pGVar3 = p->pObjs;
      if (pGVar2 < pGVar3) goto LAB_005af75d;
      if (pGVar3 + p->nObjs <= pGVar2) goto LAB_005af75d;
      iVar4 = p->nObjs * f;
      uVar9 = (int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555 + iVar4;
      if (((int)uVar9 < 0) || (uVar1 = (p->vCopies).nSize, (int)uVar1 <= (int)uVar9))
      goto LAB_005af73e;
      piVar8 = (p->vCopies).pArray;
      if (piVar8[uVar9] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_005af75d;
      uVar5 = iVar4 + (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555;
      if (((int)uVar5 < 0) || (uVar1 <= uVar5)) goto LAB_005af77c;
      uVar9 = piVar8[uVar9] ^
              ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) ^
              (uint)((ulong)*(undefined8 *)pObj >> 0x20)) >> 0x1f;
      goto LAB_005af72e;
    }
  }
  uVar9 = ~*(uint *)pObj;
  if (((uVar9 & 0x9fffffff) != 0) && ((int)*(uint *)pObj < 0 || (uVar9 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x5a,
                  "void Gia_ManCorrSpecReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)")
    ;
  }
  uVar9 = Gia_ManCorrSpecReal(pNew,p,pObj,f,nPrefix);
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
LAB_005af75d:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar5 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555 + p->nObjs * f;
  if (((int)uVar5 < 0) || ((p->vCopies).nSize <= (int)uVar5)) {
LAB_005af77c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar8 = (p->vCopies).pArray;
LAB_005af72e:
  piVar8[uVar5] = uVar9;
  return;
}

Assistant:

void Gia_ManCorrSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    if ( f >= nPrefix && (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, pRepr, f, nPrefix );
        iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        Gia_ObjSetCopyF( p, f, pObj, iLitNew );
        return;
    }
    assert( Gia_ObjIsCand(pObj) );
    iLitNew = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}